

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

Geometry * rw::Geometry::streamRead(Stream *stream)

{
  MorphTarget *pMVar1;
  FILE *pFVar2;
  bool bVar3;
  char *pcVar4;
  Geometry *this;
  Error local_80;
  Error _e_1;
  int32 hasNormals;
  int32 hasVertices;
  MorphTarget *m;
  undefined1 local_60 [4];
  int32 i_2;
  uint32 tribuf [2];
  int32 i_1;
  int32 i;
  Geometry *geo;
  Error _e;
  MaterialList *ret;
  SurfaceProperties surfProps;
  GeoStreamData buf;
  uint32 version;
  Stream *stream_local;
  
  unique0x1000043f = stream;
  bVar3 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)&buf.numVertices);
  if (bVar3) {
    Stream::read32(stack0xffffffffffffffe8,&surfProps.specular,0x10);
    this = create(buf.flags,(int32)surfProps.diffuse,(uint32)surfProps.specular);
    if (this != (Geometry *)0x0) {
      addMorphTargets(this,buf.numTriangles + -1);
      if ((uint)buf.numVertices < 0x34000) {
        Stream::read32(stack0xffffffffffffffe8,&ret,0xc);
      }
      if ((this->flags & 0x1000000) == 0) {
        if ((this->flags & 8) != 0) {
          (*stack0xffffffffffffffe8->_vptr_Stream[4])
                    (stack0xffffffffffffffe8,this->colors,(ulong)(uint)(this->numVertices << 2));
        }
        for (tribuf[1] = 0; (int)tribuf[1] < this->numTexCoordSets; tribuf[1] = tribuf[1] + 1) {
          Stream::read32(stack0xffffffffffffffe8,this->texCoords[(int)tribuf[1]],
                         this->numVertices << 3);
        }
        for (tribuf[0] = 0; (int)tribuf[0] < this->numTriangles; tribuf[0] = tribuf[0] + 1) {
          Stream::read32(stack0xffffffffffffffe8,local_60,8);
          this->triangles[(int)tribuf[0]].v[0] = local_60._2_2_;
          this->triangles[(int)tribuf[0]].v[1] = local_60._0_2_;
          this->triangles[(int)tribuf[0]].v[2] = (uint16)((uint)i_2 >> 0x10);
          this->triangles[(int)tribuf[0]].matId = (uint16)i_2;
        }
      }
      for (m._4_4_ = 0; m._4_4_ < this->numMorphTargets; m._4_4_ = m._4_4_ + 1) {
        pMVar1 = this->morphTargets;
        Stream::read32(stack0xffffffffffffffe8,&pMVar1[m._4_4_].boundingSphere,0x10);
        _e_1.code = Stream::readI32(stack0xffffffffffffffe8);
        _e_1.plugin = Stream::readI32(stack0xffffffffffffffe8);
        if (_e_1.code != 0) {
          Stream::read32(stack0xffffffffffffffe8,pMVar1[m._4_4_].vertices,this->numVertices * 0xc);
        }
        if (_e_1.plugin != 0) {
          Stream::read32(stack0xffffffffffffffe8,pMVar1[m._4_4_].normals,this->numVertices * 0xc);
        }
      }
      bVar3 = findChunk(stack0xffffffffffffffe8,8,(uint32 *)0x0,(uint32 *)0x0);
      if (bVar3) {
        if ((uint)buf.numVertices < 0x34000) {
          defaultSurfaceProps = ret;
          DAT_0016532c = surfProps.ambient;
        }
        _e = (Error)MaterialList::streamRead(stack0xffffffffffffffe8,&this->matList);
        if ((uint)buf.numVertices < 0x34000) {
          defaultSurfaceProps = (MaterialList *)streamRead::reset._0_8_;
          DAT_0016532c = streamRead::reset.diffuse;
        }
        if ((_e != (Error)0x0) &&
           (bVar3 = PluginList::streamRead((PluginList *)&s_plglist,stack0xffffffffffffffe8,this),
           bVar3)) {
          return this;
        }
      }
      else {
        local_80.plugin = 0xf;
        local_80.code = 0x80000004;
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp",
                0xb7);
        pFVar2 = _stderr;
        pcVar4 = dbgsprint(0x80000004,"MATLIST");
        fprintf(pFVar2,"%s\n",pcVar4);
        setError(&local_80);
      }
      destroy(this);
    }
  }
  else {
    geo._0_4_ = 0xf;
    geo._4_4_ = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp",0x8f);
    pFVar2 = _stderr;
    pcVar4 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar2,"%s\n",pcVar4);
    setError((Error *)&geo);
  }
  return (Geometry *)0x0;
}

Assistant:

Geometry*
Geometry::streamRead(Stream *stream)
{
	uint32 version;
	GeoStreamData buf;
	SurfaceProperties surfProps;
	MaterialList *ret;
	static SurfaceProperties reset = { 1.0f, 1.0f, 1.0f };

	if(!findChunk(stream, ID_STRUCT, nil, &version)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read32(&buf, sizeof(buf));
	Geometry *geo = Geometry::create(buf.numVertices,
	                                 buf.numTriangles, buf.flags);
	if(geo == nil)
		return nil;
	geo->addMorphTargets(buf.numMorphTargets-1);
	if(version < 0x34000)
		stream->read32(&surfProps, 12);

	if(!(geo->flags & NATIVE)){
		if(geo->flags & PRELIT)
			stream->read8(geo->colors, 4*geo->numVertices);
		for(int32 i = 0; i < geo->numTexCoordSets; i++)
			stream->read32(geo->texCoords[i],
				    2*geo->numVertices*4);
		for(int32 i = 0; i < geo->numTriangles; i++){
			uint32 tribuf[2];
			stream->read32(tribuf, 8);
			geo->triangles[i].v[0]  = tribuf[0] >> 16;
			geo->triangles[i].v[1]  = tribuf[0];
			geo->triangles[i].v[2]  = tribuf[1] >> 16;
			geo->triangles[i].matId = tribuf[1];
		}
	}

	for(int32 i = 0; i < geo->numMorphTargets; i++){
		MorphTarget *m = &geo->morphTargets[i];
		stream->read32(&m->boundingSphere, 4*4);
		int32 hasVertices = stream->readI32();
		int32 hasNormals = stream->readI32();
		if(hasVertices)
			stream->read32(m->vertices, 3*geo->numVertices*4);
		if(hasNormals)
			stream->read32(m->normals, 3*geo->numVertices*4);
	}

	if(!findChunk(stream, ID_MATLIST, nil, nil)){
		RWERROR((ERR_CHUNK, "MATLIST"));
		goto fail;
	}
	if(version < 0x34000)
		defaultSurfaceProps = surfProps;

	ret = MaterialList::streamRead(stream, &geo->matList);
	if(version < 0x34000)
		defaultSurfaceProps = reset;
	if(ret == nil)
		goto fail;
	if(s_plglist.streamRead(stream, geo))
		return geo;

fail:
	geo->destroy();
	return nil;
}